

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package_tests.hpp
# Opt level: O0

void __thiscall
pkg1::iutest_typed_test_suite_p_name_PackageTypeParamTest_::A<float>::Body(A<float> *this)

{
  bool bVar1;
  TestSuite *this_00;
  char *message;
  char *name_00;
  type **in_stack_fffffffffffffdc8;
  Fixed *this_01;
  AssertionHelper local_228;
  Fixed local_1f8;
  string local_60;
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  char *name;
  A<float> *this_local;
  
  this_00 = iuutil::GetCurrentTestSuite();
  iutest_ar._32_8_ = iutest::TestSuite::name(this_00);
  iutest::detail::AlwaysZero();
  iuutil::TestSuiteNameRemoveInstantiateAndIndexName_abi_cxx11_
            (&local_60,(iuutil *)iutest_ar._32_8_,name_00);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            ((AssertionResult *)local_40,(internal *)"\"pkg1\" \".\" \"PackageTypeParamTest\"",
             "::iuutil::TestSuiteNameRemoveInstantiateAndIndexName(name)",
             "pkg1.PackageTypeParamTest",(char *)&local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffdc8);
  std::__cxx11::string::~string((string *)&local_60);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    this_01 = &local_1f8;
    memset(this_01,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(this_01);
    message = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              (&local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/package_tests.hpp"
               ,0x4b,message,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_228,&local_1f8);
    iutest::AssertionHelper::~AssertionHelper(&local_228);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1f8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  return;
}

Assistant:

IUTEST_TYPED_TEST_P(PackageTypeParamTest, A)
    {
        const char* name = ::iuutil::GetCurrentTestSuite()->name();
        IUTEST_EXPECT_PACKAGENAME_(pkg1, PackageTypeParamTest, ::iuutil::TestSuiteNameRemoveInstantiateAndIndexName(name));
    }